

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O1

void __thiscall CInput::AddEvent(CInput *this,char *pText,int Key,int Flags)

{
  int iVar1;
  long lVar2;
  char *dst;
  
  lVar2 = (long)(this->super_IEngineInput).super_IInput.m_NumEvents;
  if (lVar2 != 0x20) {
    dst = (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar2].m_aText;
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar2].m_Key = Key;
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar2].m_Flags = Flags;
    if (pText == (char *)0x0) {
      *dst = '\0';
    }
    else {
      str_copy(dst,pText,0x81);
    }
    iVar1 = (this->super_IEngineInput).super_IInput.m_NumEvents;
    (this->super_IEngineInput).super_IInput.m_aInputEvents[iVar1].m_InputCount =
         this->m_InputCounter;
    (this->super_IEngineInput).super_IInput.m_NumEvents = iVar1 + 1;
  }
  return;
}

Assistant:

void CInput::AddEvent(char *pText, int Key, int Flags)
{
	if(m_NumEvents != INPUT_BUFFER_SIZE)
	{
		m_aInputEvents[m_NumEvents].m_Key = Key;
		m_aInputEvents[m_NumEvents].m_Flags = Flags;
		if(!pText)
			m_aInputEvents[m_NumEvents].m_aText[0] = 0;
		else
			str_copy(m_aInputEvents[m_NumEvents].m_aText, pText, sizeof(m_aInputEvents[m_NumEvents].m_aText));
		m_aInputEvents[m_NumEvents].m_InputCount = m_InputCounter;
		m_NumEvents++;
	}
}